

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

uint __thiscall kj::_::BTreeImpl::Parent::keyCount(Parent *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint i;
  Parent *this_local;
  
  bVar1 = MaybeUint::operator==(this->keys + 3,(void *)0x0);
  iVar2 = (uint)((bVar1 ^ 0xffU) & 1) * 4;
  bVar1 = MaybeUint::operator==(this->keys + (iVar2 + 1),(void *)0x0);
  uVar3 = (uint)((bVar1 ^ 0xffU) & 1) * 2 + iVar2;
  bVar1 = MaybeUint::operator==(this->keys + uVar3,(void *)0x0);
  return ((bVar1 ^ 0xffU) & 1) + uVar3;
}

Assistant:

inline uint keyCount() const {
    static_assert(Parent::NKEYS == 7, "logic here needs updating");

    // Binary search for first empty element in `keys`, or return 7 if no empty elements. We do
    // this in a branch-free manner. Since there are 8 possible results (0 through 7, inclusive),
    // this is a perfectly balanced binary search.
    uint i = (keys[3] != nullptr) * 4;
    i += (keys[i + 1] != nullptr) * 2;
    i += (keys[i    ] != nullptr);
    return i;
  }